

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void mkElimClause(vec<unsigned_int,_int> *elimclauses,Var v,Clause *c)

{
  uint uVar1;
  uint uVar2;
  vec<unsigned_int,_int> *pvVar3;
  int iVar4;
  int iVar5;
  Lit *pLVar6;
  uint *puVar7;
  uint local_40;
  uint local_3c;
  int local_38;
  uint32_t tmp;
  uint local_30;
  int local_2c;
  int local_28;
  int i;
  int v_pos;
  int first;
  Clause *c_local;
  vec<unsigned_int,_int> *pvStack_10;
  Var v_local;
  vec<unsigned_int,_int> *elimclauses_local;
  
  _v_pos = c;
  c_local._4_4_ = v;
  pvStack_10 = elimclauses;
  i = Minisat::vec<unsigned_int,_int>::size(elimclauses);
  local_28 = -1;
  local_2c = 0;
  while( true ) {
    iVar5 = local_2c;
    iVar4 = Minisat::Clause::size(_v_pos);
    pvVar3 = pvStack_10;
    if (iVar4 <= iVar5) break;
    pLVar6 = Minisat::Clause::operator[](_v_pos,local_2c);
    tmp = pLVar6->x;
    local_30 = Minisat::toInt((Lit)tmp);
    Minisat::vec<unsigned_int,_int>::push(pvVar3,&local_30);
    pLVar6 = Minisat::Clause::operator[](_v_pos,local_2c);
    local_38 = pLVar6->x;
    iVar5 = Minisat::var((Lit)local_38);
    if (iVar5 == c_local._4_4_) {
      local_28 = local_2c + i;
    }
    local_2c = local_2c + 1;
  }
  if (local_28 != -1) {
    puVar7 = Minisat::vec<unsigned_int,_int>::operator[](pvStack_10,local_28);
    local_3c = *puVar7;
    puVar7 = Minisat::vec<unsigned_int,_int>::operator[](pvStack_10,i);
    uVar1 = *puVar7;
    puVar7 = Minisat::vec<unsigned_int,_int>::operator[](pvStack_10,local_28);
    uVar2 = local_3c;
    *puVar7 = uVar1;
    puVar7 = Minisat::vec<unsigned_int,_int>::operator[](pvStack_10,i);
    pvVar3 = pvStack_10;
    *puVar7 = uVar2;
    local_40 = Minisat::Clause::size(_v_pos);
    Minisat::vec<unsigned_int,_int>::push(pvVar3,&local_40);
    return;
  }
  __assert_fail("v_pos != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                ,0x1d7,"void mkElimClause(vec<uint32_t> &, Var, Clause &)");
}

Assistant:

static void mkElimClause(vec<uint32_t>& elimclauses, Var v, Clause& c)
{
    int first = elimclauses.size();
    int v_pos = -1;

    // Copy clause to elimclauses-vector. Remember position where the
    // variable 'v' occurs:
    for (int i = 0; i < c.size(); i++){
        elimclauses.push(toInt(c[i]));
        if (var(c[i]) == v)
            v_pos = i + first;
    }
    assert(v_pos != -1);

    // Swap the first literal with the 'v' literal, so that the literal
    // containing 'v' will occur first in the clause:
    uint32_t tmp = elimclauses[v_pos];
    elimclauses[v_pos] = elimclauses[first];
    elimclauses[first] = tmp;

    // Store the length of the clause last:
    elimclauses.push(c.size());
}